

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.h
# Opt level: O0

void __thiscall server::ctfservmode::deadflag(ctfservmode *this,int i)

{
  bool bVar1;
  flag *this_00;
  int local_28;
  int limit;
  flag *f;
  int i_local;
  ctfservmode *this_local;
  
  this_00 = vector<server::ctfservmode::flag>::operator[](&this->flags,i);
  if (this_00->holdtime != 0) {
    bVar1 = flag::hasowner(this_00);
    if (((bVar1) || (this_00->droptime == 0)) || (this_00->droptime < this_00->holdtime)) {
      local_28 = lastmillis;
    }
    else {
      local_28 = this_00->droptime;
    }
    this_00->holdtime = this_00->holdtime + 5000;
    if (local_28 <= this_00->holdtime) {
      this_00->holdtime = 0;
    }
  }
  return;
}

Assistant:

void deadflag(int i)
    {
        flag &f = flags[i];
        if(f.holdtime)
        {
            int limit = !f.hasowner() && f.droptime && f.droptime >= f.holdtime ? f.droptime : lastmillis;
            f.holdtime += HOLDDEATHPENALTY*1000;
            if(f.holdtime >= limit) f.holdtime = 0;
        }
    }